

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

void virtual_proc_start(dill_stream c,char *subr_name,int arg_count,arg_info_list args,
                       dill_reg *arglist)

{
  undefined8 *puVar1;
  virtual_mach_info vmi;
  int i;
  dill_reg *arglist_local;
  arg_info_list args_local;
  int arg_count_local;
  char *subr_name_local;
  dill_stream c_local;
  
  puVar1 = (undefined8 *)c->p->mach_info;
  *puVar1 = args;
  *(undefined4 *)(puVar1 + 3) = 0xffffffff;
  for (i = 0; i < arg_count; i = i + 1) {
    c->p->c_param_args[i].in_reg = i;
  }
  return;
}

Assistant:

extern void
virtual_proc_start(dill_stream c,
                   char* subr_name,
                   int arg_count,
                   arg_info_list args,
                   dill_reg* arglist)
{
    int i;
    virtual_mach_info vmi = (virtual_mach_info)c->p->mach_info;
    vmi->arg_info = args;
    vmi->prefix_code_start = -1;
    for (i = 0; i < arg_count; i++) {
        c->p->c_param_args[i].in_reg = i;
    }
}